

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QCollapsibleFrame.cpp
# Opt level: O2

void __thiscall QCollapsibleFrame::setTitle(QCollapsibleFrame *this,QWidget *title)

{
  Data *pDVar1;
  QCollapsibleFramePrivate *this_00;
  bool toggled;
  QWidget *pQVar2;
  
  pDVar1 = (this->d->title).wp.d;
  if ((pDVar1 == (Data *)0x0) || (*(int *)(pDVar1 + 4) == 0)) {
    pQVar2 = (QWidget *)0x0;
  }
  else {
    pQVar2 = (QWidget *)(this->d->title).wp.value;
  }
  if (pQVar2 != title) {
    takeTitle(this);
    if (title != (QWidget *)0x0) {
      QWeakPointer<QObject>::assign<QObject>(&(this->d->title).wp,(QObject *)title);
      QBoxLayout::addWidget(this->d->horizontalLayout,title,1,0);
      this_00 = this->d;
      toggled = (bool)QAbstractButton::isChecked();
      QCollapsibleFramePrivate::button_toggled(this_00,toggled);
    }
    titleChanged(this);
    return;
  }
  return;
}

Assistant:

void QCollapsibleFrame::setTitle(QWidget *title) {
    if (d->title != title) {
        /*delete*/ takeTitle();

        if (title) {
            d->title = title;
            d->horizontalLayout->addWidget(title, 1);
            d->button_toggled(d->button->isChecked());
        }

        Q_EMIT titleChanged();
    }
}